

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,SubscriptWithChevrons *s)

{
  Expression *pEVar1;
  SubscriptWithChevrons *s_local;
  ASTVisitor *this_local;
  
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)&s->lhs);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&s->rhs);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  return;
}

Assistant:

virtual void visit (AST::SubscriptWithChevrons& s)
    {
        visitObject (s.lhs);
        visitObject (*s.rhs);
    }